

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::WriteTargetClean(cmGlobalNinjaGenerator *this,ostream *os)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined4 extraout_var;
  size_type *psVar6;
  cmNinjaRule rule;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  ostream *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  char *local_178;
  size_type local_170;
  char local_168;
  uint7 uStack_167;
  undefined8 uStack_160;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  pointer pbStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  pointer pbStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  pointer pbStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  pointer pbStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  _Base_ptr local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  bVar3 = WriteTargetCleanAdditional(this,os);
  local_178 = &local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"CLEAN","");
  if (local_178 == &local_168) {
    local_158._24_8_ = uStack_160;
    local_158._0_8_ = local_158 + 0x10;
  }
  else {
    local_158._0_8_ = local_178;
  }
  local_158._16_8_ = (ulong)uStack_167 << 8;
  local_158._8_8_ = local_170;
  local_170 = 0;
  local_168 = '\0';
  local_130 = 0;
  local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
  local_118._M_p = (pointer)&local_108;
  pbStack_110 = (pointer)0x0;
  local_108._M_allocated_capacity = local_108._M_allocated_capacity & 0xffffffffffffff00;
  local_f8._M_p = (pointer)&local_e8;
  pbStack_f0 = (pointer)0x0;
  local_e8._M_allocated_capacity = local_e8._M_allocated_capacity & 0xffffffffffffff00;
  local_d8._M_p = (pointer)&local_c8;
  pbStack_d0 = (pointer)0x0;
  local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
  local_b8._M_p = (pointer)&local_a8;
  pbStack_b0 = (pointer)0x0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_p = (pointer)&local_88;
  local_90 = (_Base_ptr)0x0;
  local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
  local_78._M_p = local_68;
  local_70._M_p = (pointer)0x0;
  local_68._0_8_ = local_68._0_8_ & 0xffffffffffffff00;
  local_68._16_8_ = &local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_38 = false;
  local_178 = &local_168;
  local_138._M_p = (pointer)&local_128;
  NinjaCmd_abi_cxx11_(&local_1e0,this);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  paVar1 = &local_1c0.field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1c0.field_2._M_allocated_capacity = *psVar6;
    local_1c0.field_2._8_8_ = plVar5[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar6;
    local_1c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1c0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1a0 = os;
  std::__cxx11::string::operator=((string *)&local_138,(string *)&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_118,0,(char *)pbStack_110,0x558a8a);
  std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)pbStack_f0,0x558aa6);
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_158);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_158);
  local_198 = &local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"CLEAN","");
  local_158._8_8_ = 0;
  local_158._16_8_ = local_158._16_8_ & 0xffffffffffffff00;
  if (local_198 == &local_188) {
    local_128._8_8_ = local_188._8_8_;
    local_138._M_p = (pointer)&local_128;
  }
  else {
    local_138._M_p = (pointer)local_198;
  }
  local_88._M_allocated_capacity = (size_type)&local_98;
  local_130 = local_190;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  local_98._M_p = local_98._M_p & 0xffffffff00000000;
  local_90 = (_Base_ptr)0x0;
  local_118._M_p = (pointer)0x0;
  pbStack_110 = (pointer)0x0;
  local_108._M_allocated_capacity = 0;
  local_108._8_8_ = 0;
  local_f8._M_p = (pointer)0x0;
  pbStack_f0 = (pointer)0x0;
  local_e8._M_allocated_capacity = 0;
  local_e8._8_8_ = 0;
  local_d8._M_p = (pointer)0x0;
  pbStack_d0 = (pointer)0x0;
  local_c8._M_allocated_capacity = 0;
  local_c8._8_8_ = 0;
  local_b8._M_p = (pointer)0x0;
  pbStack_b0 = (pointer)0x0;
  local_a8._M_allocated_capacity = 0;
  local_78._M_p = (pointer)0x0;
  local_70._M_p = local_68 + 8;
  local_68._0_8_ = 0;
  local_68[8] = '\0';
  local_198 = &local_188;
  local_158._0_8_ = local_158 + 0x10;
  local_88._8_8_ = local_88._M_allocated_capacity;
  std::__cxx11::string::_M_replace((ulong)local_158,0,(char *)0x0,0x558ac9);
  iVar4 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x21])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,(char *)CONCAT44(extraout_var,iVar4),&local_1e1);
  NinjaOutputPath(&local_1c0,this,&local_1e0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
             &local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_1e0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"CMakeFiles/clean.additional","");
    NinjaOutputPath(&local_1c0,this,&local_1e0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_e8._M_local_buf,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  WriteBuild(this,local_1a0,(cmNinjaBuild *)local_158,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_158);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetClean(std::ostream& os)
{
  // -- Additional clean target
  bool additionalFiles = WriteTargetCleanAdditional(os);

  // -- Default clean target
  // Write rule
  {
    cmNinjaRule rule("CLEAN");
    rule.Command = NinjaCmd() + " -t clean";
    rule.Description = "Cleaning all built files...";
    rule.Comment = "Rule for cleaning all built files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN");
    build.Comment = "Clean all the built files.";
    build.Outputs.push_back(this->NinjaOutputPath(this->GetCleanTargetName()));
    if (additionalFiles) {
      build.ExplicitDeps.push_back(
        this->NinjaOutputPath(this->GetAdditionalCleanTargetName()));
    }
    WriteBuild(os, build);
  }
}